

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

variable_order_t * __thiscall
merlin::graphical_model::order
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  pointer *this_00;
  allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_> *this_01;
  pointer *this_02;
  value_type vVar1;
  const_iterator ci;
  const_iterator ci_00;
  unsigned_long uVar2;
  ulong uVar3;
  bool bVar4;
  Type TVar5;
  int __n;
  size_t sVar6;
  iterator iVar7;
  iterator iVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  _Base_ptr p_Var12;
  difference_type dVar13;
  pointer ppVar14;
  reference pvVar15;
  size_type sVar16;
  variable *this_03;
  reference rVar17;
  variable vVar18;
  double local_3d8;
  pair<double,_unsigned_long> local_3d0;
  _Base_ptr local_3c0;
  _Base_ptr local_3b8;
  _Base_ptr local_3b0;
  size_t local_3a8;
  size_t jj;
  variable_set *pvStack_398;
  size_t local_390;
  size_t sStack_388;
  undefined1 local_380 [8];
  const_iterator j_3;
  variable local_350;
  size_t local_340;
  size_t v_3;
  variable_set *pvStack_330;
  size_t local_328;
  size_t sStack_320;
  undefined1 local_318 [8];
  const_iterator j_2;
  variable_set fix;
  variable_set vi;
  variable local_268;
  vindex local_258;
  size_t i_2;
  _Base_ptr local_248;
  _Base_ptr local_240;
  _Base_ptr local_238;
  _Base_ptr local_230;
  undefined1 local_228 [8];
  variable v_2;
  _Self local_210;
  iterator fi;
  iterator last;
  iterator first;
  size_t ii;
  double local_1e8;
  pair<double,_unsigned_long> local_1e0;
  _Base_ptr local_1d0;
  unsigned_long local_1c8;
  size_t v_1;
  size_t local_1b8;
  reference local_1b0;
  ulong local_1a0;
  size_t v;
  variable_set sumVars;
  undefined1 local_158 [8];
  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  reverse;
  score_map_t scores;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  ulong local_f0;
  size_t j_1;
  size_t j;
  size_t i;
  variable local_b8;
  size_t local_a8;
  variable local_a0;
  size_t local_90;
  reference local_88;
  ulong local_78;
  size_t i_1;
  variable_order_t maxOrd;
  variable_order_t sumOrd;
  vector<bool,_std::allocator<bool>_> *var_types_local;
  graphical_model *this_local;
  variable_order_t *pvStack_10;
  OrderMethod ord_type_local;
  variable_order_t *order;
  
  this_local._4_4_ = ord_type.t_;
  pvStack_10 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  sVar6 = nvar(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(__return_storage_ptr__,sVar6);
  TVar5 = OrderMethod::operator_cast_to_Type((OrderMethod *)((long)&this_local + 4));
  if (TVar5 == Random) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &maxOrd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1);
    local_78 = 0;
    while( true ) {
      uVar3 = local_78;
      sVar6 = nvar(this);
      if (sVar6 <= uVar3) break;
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,local_78);
      local_88 = rVar17;
      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_88);
      if (bVar4) {
        vVar18 = var(this,local_78);
        local_a0 = vVar18;
        local_90 = variable::label(&local_a0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1,&local_90);
      }
      else {
        vVar18 = var(this,local_78);
        local_b8 = vVar18;
        local_a8 = variable::label(&local_b8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &maxOrd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,&local_a8);
      }
      local_78 = local_78 + 1;
    }
    this_00 = &maxOrd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar7._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar8._M_current);
    iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1);
    iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar7._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar8._M_current);
    j = 0;
    j_1 = 0;
    while( true ) {
      sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &maxOrd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 <= j_1) break;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &maxOrd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,j_1);
      vVar1 = *pvVar10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (__return_storage_ptr__,j);
      *pvVar10 = vVar1;
      j_1 = j_1 + 1;
      j = j + 1;
    }
    local_f0 = 0;
    while( true ) {
      sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1);
      if (sVar9 <= local_f0) break;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1,local_f0);
      vVar1 = *pvVar10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (__return_storage_ptr__,j);
      *pvVar10 = vVar1;
      local_f0 = local_f0 + 1;
      j = j + 1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i_1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &maxOrd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    mrf((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
        &scores._M_t._M_impl.super__Rb_tree_header._M_node_count,this);
    std::
    multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::multimap((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                *)&reverse.
                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar6 = nvar(this);
    this_01 = (allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_> *)
              ((long)&sumVars.m_d + 7);
    std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>::allocator
              (this_01);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
    ::vector((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
              *)local_158,sVar6,this_01);
    std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>::~allocator
              ((allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_> *)
               ((long)&sumVars.m_d + 7));
    variable_set::variable_set((variable_set *)&v);
    local_1a0 = 0;
    while( true ) {
      uVar3 = local_1a0;
      sVar6 = nvar(this);
      if (sVar6 <= uVar3) break;
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,local_1a0);
      local_1b0 = rVar17;
      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_1b0);
      if (!bVar4) {
        vVar18 = var(this,local_1a0);
        local_1b8 = vVar18.m_states;
        v_1 = vVar18.m_label;
        variable_set::operator|=((variable_set *)&v,(variable *)&v_1);
      }
      local_1a0 = local_1a0 + 1;
    }
    local_1c8 = 0;
    while( true ) {
      uVar2 = local_1c8;
      sVar6 = nvar(this);
      if (sVar6 <= uVar2) break;
      local_1e8 = order_score(this,(vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                                    *)&scores._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              local_1c8,this_local._4_4_);
      std::pair<double,_unsigned_long>::pair<double,_unsigned_long_&,_true>
                (&local_1e0,&local_1e8,&local_1c8);
      local_1d0 = (_Base_ptr)
                  std::
                  multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                  ::insert<std::pair<double,unsigned_long>>
                            ((multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                              *)&reverse.
                                 super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e0);
      pvVar11 = std::
                vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                ::operator[]((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                              *)local_158,local_1c8);
      pvVar11->_M_node = local_1d0;
      local_1c8 = local_1c8 + 1;
    }
    first._M_node = (_Base_ptr)0x0;
    while( true ) {
      p_Var12 = (_Base_ptr)nvar(this);
      if (p_Var12 <= first._M_node) break;
      std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::_Rb_tree_iterator(&last);
      std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::_Rb_tree_iterator(&fi);
      sVar6 = variable_set::size((variable_set *)&v);
      if (sVar6 == 0) {
        this_02 = &reverse.
                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_238 = (_Base_ptr)
                    std::
                    multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                    ::begin((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                             *)this_02);
        last._M_node = local_238;
        ppVar14 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->(&last)
        ;
        i_2 = (size_t)std::
                      multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                      ::upper_bound((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                                     *)this_02,&ppVar14->first);
        local_248 = last._M_node;
        local_240 = (_Base_ptr)i_2;
        fi._M_node = (_Base_ptr)i_2;
        dVar13 = std::distance<std::_Rb_tree_iterator<std::pair<double_const,unsigned_long>>>
                           ((_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>)last._M_node
                            ,(_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>)i_2);
        __n = randi((int)dVar13);
        std::advance<std::_Rb_tree_iterator<std::pair<double_const,unsigned_long>>,int>(&last,__n);
      }
      else {
        local_210._M_node =
             (_Base_ptr)
             std::
             multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
             ::begin((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                      *)&reverse.
                         super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        while( true ) {
          v_2.m_states = (size_t)std::
                                 multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                                 ::end((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                                        *)&reverse.
                                           super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar4 = std::operator!=(&local_210,(_Self *)&v_2.m_states);
          if (!bVar4) break;
          ppVar14 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->
                              (&local_210);
          vVar18 = var(this,ppVar14->second);
          v_2.m_label = vVar18.m_states;
          local_228 = (undefined1  [8])vVar18.m_label;
          bVar4 = variable_set::contains((variable_set *)&v,(variable *)local_228);
          if (bVar4) {
            last._M_node = local_210._M_node;
            ppVar14 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->
                                (&last);
            local_230 = (_Base_ptr)
                        std::
                        multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                        ::upper_bound((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                                       *)&reverse.
                                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &ppVar14->first);
            fi = (iterator)local_230;
            break;
          }
          std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator++(&local_210);
        }
      }
      ppVar14 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->(&last);
      local_258 = ppVar14->second;
      vVar18 = var(this,local_258);
      local_268 = vVar18;
      sVar6 = variable::label(&local_268);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (__return_storage_ptr__,(size_type)first._M_node);
      *pvVar10 = sVar6;
      pvVar11 = std::
                vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                ::operator[]((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                              *)local_158,local_258);
      std::
      multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
      ::erase_abi_cxx11_((multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                          *)&reverse.
                             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11->_M_node);
      vVar18 = var(this,local_258);
      vi.m_d = (vsize *)vVar18.m_label;
      variable_set::operator/=((variable_set *)&v,(variable *)&vi.m_d);
      pvVar15 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::operator[]
                          ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                           &scores._M_t._M_impl.super__Rb_tree_header._M_node_count,local_258);
      variable_set::variable_set((variable_set *)&fix.m_d,pvVar15);
      variable_set::variable_set((variable_set *)&j_2.m_tmp.m_states);
      variable_set::begin((const_iterator *)local_318,(variable_set *)&fix.m_d);
      while( true ) {
        variable_set::end((const_iterator *)&v_3,(variable_set *)&fix.m_d);
        ci.m_vs = pvStack_330;
        ci.m_i = v_3;
        ci.m_tmp.m_label = local_328;
        ci.m_tmp.m_states = sStack_320;
        bVar4 = variable_set::const_iterator::operator!=((const_iterator *)local_318,ci);
        if (!bVar4) break;
        vVar18 = variable_set::const_iterator::operator*((const_iterator *)local_318);
        local_350 = vVar18;
        local_340 = _vindex(this,&local_350);
        pvVar15 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                  operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                             &scores._M_t._M_impl.super__Rb_tree_header._M_node_count,local_340);
        variable_set::operator|=(pvVar15,(variable_set *)&fix.m_d);
        vVar18 = var(this,local_258);
        j_3.m_tmp.m_states = vVar18.m_label;
        pvVar15 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                  operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                             &scores._M_t._M_impl.super__Rb_tree_header._M_node_count,local_340);
        variable_set::operator/=(pvVar15,(variable *)&j_3.m_tmp.m_states);
        sVar6 = variable_set::size((variable_set *)&j_2.m_tmp.m_states);
        sVar16 = std::
                 multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                 ::size((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                         *)&reverse.
                            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar6 < sVar16) {
          TVar5 = OrderMethod::operator_cast_to_Type((OrderMethod *)((long)&this_local + 4));
          if (TVar5 != MinWidth) {
            TVar5 = OrderMethod::operator_cast_to_Type((OrderMethod *)((long)&this_local + 4));
            if (TVar5 != WtMinWidth) {
              pvVar15 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                        operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                                    *)&scores._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   local_340);
              variable_set::operator|=((variable_set *)&j_2.m_tmp.m_states,pvVar15);
              goto LAB_001b044d;
            }
          }
          pvVar15 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                    operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                                *)&scores._M_t._M_impl.super__Rb_tree_header._M_node_count,local_340
                              );
          variable_set::operator|=((variable_set *)&j_2.m_tmp.m_states,pvVar15);
        }
LAB_001b044d:
        variable_set::const_iterator::operator++((const_iterator *)local_318);
      }
      variable_set::begin((const_iterator *)local_380,(variable_set *)&j_2.m_tmp.m_states);
      while( true ) {
        variable_set::end((const_iterator *)&jj,(variable_set *)&j_2.m_tmp.m_states);
        ci_00.m_vs = pvStack_398;
        ci_00.m_i = jj;
        ci_00.m_tmp.m_label = local_390;
        ci_00.m_tmp.m_states = sStack_388;
        bVar4 = variable_set::const_iterator::operator!=((const_iterator *)local_380,ci_00);
        if (!bVar4) break;
        this_03 = variable_set::const_iterator::operator->((const_iterator *)local_380);
        local_3a8 = variable::label(this_03);
        pvVar11 = std::
                  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                  ::operator[]((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                *)local_158,local_3a8);
        local_3b0 = pvVar11->_M_node;
        local_3b8 = (_Base_ptr)
                    std::
                    multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                    ::erase_abi_cxx11_((multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                        *)&reverse.
                                           super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (iterator)local_3b0);
        local_3d8 = order_score(this,(vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                                      *)&scores._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                local_3a8,this_local._4_4_);
        std::pair<double,_unsigned_long>::pair<double,_unsigned_long_&,_true>
                  (&local_3d0,&local_3d8,&local_3a8);
        local_3c0 = (_Base_ptr)
                    std::
                    multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                    ::insert<std::pair<double,unsigned_long>>
                              ((multimap<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                *)&reverse.
                                   super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3d0);
        pvVar11 = std::
                  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                  ::operator[]((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                *)local_158,local_3a8);
        pvVar11->_M_node = local_3c0;
        variable_set::const_iterator::operator++((const_iterator *)local_380);
      }
      variable_set::~variable_set((variable_set *)&j_2.m_tmp.m_states);
      variable_set::~variable_set((variable_set *)&fix.m_d);
      first._M_node = (_Base_ptr)((long)&(first._M_node)->_M_color + 1);
    }
    variable_set::~variable_set((variable_set *)&v);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
    ::~vector((vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
               *)local_158);
    std::
    multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~multimap((multimap<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                 *)&reverse.
                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector
              ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
               &scores._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return __return_storage_ptr__;
}

Assistant:

variable_order_t order(OrderMethod ord_type, std::vector<bool> var_types) const {
		variable_order_t order;
		order.resize(nvar());

		if (ord_type == OrderMethod::Random) {	// random orders are treated here
			variable_order_t sumOrd, maxOrd;
			for (size_t i = 0; i < nvar(); i++) {
				//   build a list of all the variables
				if (var_types[i] == true) maxOrd.push_back(var(i).label());
				else sumOrd.push_back(var(i).label());
			}

			std::random_shuffle(sumOrd.begin(), sumOrd.end());//   and randomly permute them
			std::random_shuffle(maxOrd.begin(), maxOrd.end());
			size_t i = 0;
			for (size_t j = 0; j < sumOrd.size(); ++j) order[i++] = sumOrd[j];
			for (size_t j = 0; j < maxOrd.size(); ++j) order[i++] = maxOrd[j];
			return order;											//   then return
		}

		std::vector<variable_set> adj = mrf();
		typedef std::pair<double, size_t> node_score_t;
		typedef std::multimap<double, size_t> score_map_t;
		score_map_t scores;
		std::vector<score_map_t::iterator> reverse(nvar());

		// get the sum and max variables
		variable_set sumVars;
		for (size_t v = 0; v < nvar(); ++v) {
			if (var_types[v] == false) sumVars |= var(v);
		}

		// get initial scores
		for (size_t v = 0; v < nvar(); ++v) {
			reverse[v] = scores.insert(node_score_t(order_score(adj, v, ord_type), v));
		}

		// Iterate through, selecting sum variables first
		for (size_t ii = 0; ii < nvar(); ++ii) {// Iterate through, selecting variables

			score_map_t::iterator first, last;
			if (sumVars.size() > 0) { // Choose a random entry from among the smallest sum vars
				for (score_map_t::iterator fi = scores.begin(); fi != scores.end(); ++fi) {
					variable v = var(fi->second);
					if (sumVars.contains(v)) {
						first = fi;
						last = scores.upper_bound(first->first);
						break;
					}
				}
			} else {
				first = scores.begin();// Choose a random entry from among the smallest
				last = scores.upper_bound(first->first);
				std::advance(first, randi(std::distance(first, last)));
			}
			size_t i = first->second;

			order[ii] = var(i).label(); // save its label in the ordering
			scores.erase(reverse[i]);	// remove it from our list
			sumVars /= var(i);
			variable_set vi = adj[i]; // go through adjacent variables (copy: adj may change)
			variable_set fix;					//   and keep track of which need updating
			for (variable_set::const_iterator j = vi.begin(); j != vi.end(); ++j) {
				size_t v = _vindex(*j);
				adj[v] |= vi;             // and update their adjacency structures
				adj[v] /= var(i);
				if (fix.size() < scores.size()) {
					if (ord_type == OrderMethod::MinWidth
							|| ord_type == OrderMethod::WtMinWidth)
						fix |= adj[v]; //var(v);				// (width methods only need v, not nbrs)
					else
						fix |= adj[v];	// come back and recalculate their scores
				}
			}
			for (variable_set::const_iterator j = fix.begin(); j != fix.end(); ++j) {
				size_t jj = j->label();
				scores.erase(reverse[jj]);	// remove and update (score,index) pairs
				reverse[jj] = scores.insert(node_score_t(order_score(adj, jj, ord_type), jj));
			}
		}

		return order;
	}